

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Stress::anon_unknown_0::TextureCase::init(TextureCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  uint uVar4;
  TextureType extraout_EAX;
  TextureType TVar5;
  undefined4 extraout_var;
  long lVar6;
  NotSupportedError *this_00;
  int y;
  long lVar7;
  int x_1;
  long lVar8;
  EVP_PKEY_CTX *ctx_00;
  pointer puVar9;
  int x;
  long lVar10;
  allocator<char> local_211;
  vector<unsigned_int,_std::allocator<unsigned_int>_> texData;
  GLint maxTextureSize;
  Random rnd;
  MessageBuilder local_1b0;
  undefined4 extraout_var_00;
  
  ctx_00 = (EVP_PKEY_CTX *)&maxTextureSize;
  maxTextureSize = 0;
  iVar2 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))(0xd33);
  if (maxTextureSize < 0x80) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&texData,"GL_MAX_TEXTURE_SIZE must be at least ",&local_211);
    de::toString<int>((string *)&rnd,&(anonymous_namespace)::TEST_TEXTURE_SIZE);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texData,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd);
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)&local_1b0);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  RenderCase::init(&this->super_RenderCase,ctx_00);
  iVar2 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  lVar6 = CONCAT44(extraout_var_00,iVar2);
  deRandom_init(&rnd.m_rnd,0x3039);
  (**(code **)(lVar6 + 0x6f8))(1,&this->m_textureID);
  (**(code **)(lVar6 + 0xb8))(0xde1,this->m_textureID);
  if (this->m_uploadType == UPLOAD_PBO) {
    (**(code **)(lVar6 + 0x6c8))(1,&this->m_pboID);
    (**(code **)(lVar6 + 0x40))(0x88ec,this->m_pboID);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"TextureCase::init",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                    ,0x438);
  }
  TVar5 = this->m_textureType;
  if (TVar5 == TEXTURE_DEPTH) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&texData,0x4000,(allocator_type *)&local_1b0);
    puVar9 = texData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (this->m_uploadType != UPLOAD_CLIENT) {
      puVar9 = (pointer)0x0;
    }
    local_1b0.m_log =
         ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Creating a 2D depth texture and filling it with special floating point values.\n"
                   );
    std::operator<<((ostream *)poVar1,"  TEXTURE_COMPARE_MODE = COMPARE_REF_TO_TEXTURE");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    lVar10 = 0;
    for (lVar8 = 0; lVar8 != 0x80; lVar8 = lVar8 + 1) {
      for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 1) {
        uVar4 = de::Random::choose<unsigned_int,unsigned_int_const*>
                          (&rnd,&(anonymous_namespace)::s_specialFloats,
                           (uint *)"N4deqp5gles36Stress12_GLOBAL__N_111UniformCaseE");
        *(uint *)((long)texData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar7 * 4 + lVar10) = uVar4;
      }
      lVar10 = lVar10 + 0x200;
    }
    if (this->m_uploadType == UPLOAD_PBO) {
      (**(code **)(lVar6 + 0x150))
                (0x88ec,(long)texData.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)texData.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                 texData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,0x88e4);
    }
    (**(code **)(lVar6 + 0x1310))(0xde1,0,0x8cac,0x80,0x80,0,0x1902,0x1406,puVar9);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x884c,0x884e);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x884d,0x201);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x2800,0x2601);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x2801,0x2601);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"TextureCase::init",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                    ,0x468);
  }
  else {
    if (TVar5 != TEXTURE_FLOAT) goto LAB_0072a749;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&texData,0x8000,(allocator_type *)&local_1b0);
    puVar9 = texData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (this->m_uploadType != UPLOAD_CLIENT) {
      puVar9 = (pointer)0x0;
    }
    local_1b0.m_log =
         ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Creating a 2D 2-component float texture. Pixel contents are of form (special, 1)."
                   );
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    lVar8 = 4;
    for (lVar10 = 0; lVar10 != 0x80; lVar10 = lVar10 + 1) {
      for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 1) {
        uVar4 = de::Random::choose<unsigned_int,unsigned_int_const*>
                          (&rnd,&(anonymous_namespace)::s_specialFloats,
                           (uint *)"N4deqp5gles36Stress12_GLOBAL__N_111UniformCaseE");
        *(uint *)((long)texData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar7 * 8 + lVar8 + -4) = uVar4;
        *(undefined4 *)
         ((long)texData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start + lVar7 * 8 + lVar8) = 0x3f800000;
      }
      lVar8 = lVar8 + 0x400;
    }
    if (this->m_uploadType == UPLOAD_PBO) {
      (**(code **)(lVar6 + 0x150))
                (0x88ec,(long)texData.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)texData.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                 texData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,0x88e4);
    }
    (**(code **)(lVar6 + 0x1310))(0xde1,0,0x8230,0x80,0x80,0,0x8227,0x1406,puVar9);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x2800,0x2600);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x2801,0x2600);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"TextureCase::init",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                    ,0x450);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&texData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  TVar5 = extraout_EAX;
LAB_0072a749:
  if (this->m_uploadType == UPLOAD_PBO) {
    local_1b0.m_log =
         ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"PBO used for image upload.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    (**(code **)(lVar6 + 0x40))(0x88ec,0);
    TVar5 = (**(code **)(lVar6 + 0x438))(1,&this->m_pboID);
    this->m_pboID = 0;
  }
  return TVar5;
}

Assistant:

void TextureCase::init (void)
{
	// requirements
	{
		GLint maxTextureSize = 0;
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);
		if (maxTextureSize < TEST_TEXTURE_SIZE)
			throw tcu::NotSupportedError(std::string("GL_MAX_TEXTURE_SIZE must be at least ") + de::toString(TEST_TEXTURE_SIZE));
	}

	RenderCase::init();

	// gen texture
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		de::Random				rnd			(12345);

		gl.genTextures(1, &m_textureID);
		gl.bindTexture(GL_TEXTURE_2D, m_textureID);

		if (m_uploadType == UPLOAD_PBO)
		{
			gl.genBuffers(1, &m_pboID);
			gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, m_pboID);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureCase::init");
		}

		if (m_textureType == TEXTURE_FLOAT)
		{
			std::vector<deUint32>	texData	(TEST_TEXTURE_SIZE*TEST_TEXTURE_SIZE*2);
			const deUint32*			dataPtr = (m_uploadType == UPLOAD_CLIENT) ? (&texData[0]) : (DE_NULL);

			m_testCtx.getLog() << tcu::TestLog::Message << "Creating a 2D 2-component float texture. Pixel contents are of form (special, 1)." << tcu::TestLog::EndMessage;

			// set green channel to 1.0
			for (int x = 0; x < TEST_TEXTURE_SIZE; ++x)
			for (int y = 0; y < TEST_TEXTURE_SIZE; ++y)
			{
				texData[(x * TEST_TEXTURE_SIZE + y) * 2 + 0] = rnd.choose<deUint32>(DE_ARRAY_BEGIN(s_specialFloats), DE_ARRAY_END(s_specialFloats));
				texData[(x * TEST_TEXTURE_SIZE + y) * 2 + 1] = 0x3F800000;	// one
			}

			if (m_uploadType == UPLOAD_PBO)
				gl.bufferData(GL_PIXEL_UNPACK_BUFFER, (glw::GLsizeiptr)(texData.size() * sizeof(deUint32)), &texData[0], GL_STATIC_DRAW);

			gl.texImage2D(GL_TEXTURE_2D, 0, GL_RG32F, TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE, 0, GL_RG, GL_FLOAT, dataPtr);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureCase::init");
		}
		else if (m_textureType == TEXTURE_DEPTH)
		{
			std::vector<deUint32>	texData	(TEST_TEXTURE_SIZE*TEST_TEXTURE_SIZE);
			const deUint32*			dataPtr = (m_uploadType == UPLOAD_CLIENT) ? (&texData[0]) : (DE_NULL);

			m_testCtx.getLog() << tcu::TestLog::Message
				<< "Creating a 2D depth texture and filling it with special floating point values.\n"
				<< "  TEXTURE_COMPARE_MODE = COMPARE_REF_TO_TEXTURE"
				<< tcu::TestLog::EndMessage;

			for (int x = 0; x < TEST_TEXTURE_SIZE; ++x)
			for (int y = 0; y < TEST_TEXTURE_SIZE; ++y)
				texData[x * TEST_TEXTURE_SIZE + y] = rnd.choose<deUint32>(DE_ARRAY_BEGIN(s_specialFloats), DE_ARRAY_END(s_specialFloats));

			if (m_uploadType == UPLOAD_PBO)
				gl.bufferData(GL_PIXEL_UNPACK_BUFFER, (glw::GLsizeiptr)(texData.size() * sizeof(deUint32)), &texData[0], GL_STATIC_DRAW);

			gl.texImage2D(GL_TEXTURE_2D, 0, GL_DEPTH_COMPONENT32F, TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE, 0, GL_DEPTH_COMPONENT, GL_FLOAT, dataPtr);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE, GL_COMPARE_REF_TO_TEXTURE);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC, GL_LESS);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureCase::init");
		}
		else
			DE_ASSERT(false);

		if (m_uploadType == UPLOAD_PBO)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "PBO used for image upload." << tcu::TestLog::EndMessage;

			gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);
			gl.deleteBuffers(1, &m_pboID);
			m_pboID = 0;
		}
	}
}